

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O2

Vec_Int_t * Bmc_ManBCoreReadPivots(char *pName)

{
  int iVar1;
  undefined8 in_RAX;
  Vec_Int_t *p;
  FILE *__stream;
  int Num;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  p = Vec_IntAlloc((int)pName);
  __stream = fopen(pName,"r");
  while( true ) {
    iVar1 = __isoc99_fscanf(__stream,"%d",(long)&uStack_28 + 4);
    if (iVar1 != 1) break;
    Vec_IntPush(p,uStack_28._4_4_);
  }
  fclose(__stream);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collect pivot variables.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Bmc_ManBCoreReadPivots( char * pName )
{
    int Num;
    Vec_Int_t * vPivots = Vec_IntAlloc( 100 );
    FILE * pFile = fopen( pName, "r" );
    while ( fscanf( pFile, "%d", &Num ) == 1 )
        Vec_IntPush( vPivots, Num );
    fclose( pFile );
    return vPivots;
}